

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O2

bool __thiscall
YAML::detail::node::equals<std::__cxx11::string>
          (node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs,
          shared_memory_holder *pMemory)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> lhs;
  __shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2> _Stack_98;
  string local_88;
  Node local_68;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  std::__shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_98,
             &pMemory->super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>);
  Node::Node(&local_68,this,(shared_memory_holder *)&_Stack_98);
  bVar1 = convert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::decode(&local_68,&local_88);
  Node::~Node(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_98._M_refcount);
  if (bVar1) {
    _Var2 = std::operator==(&local_88,rhs);
  }
  else {
    _Var2 = false;
  }
  std::__cxx11::string::~string((string *)&local_88);
  return _Var2;
}

Assistant:

inline bool node::equals(const T& rhs, shared_memory_holder pMemory) {
  T lhs;
  if (convert<T>::decode(Node(*this, pMemory), lhs)) {
    return lhs == rhs;
  }
  return false;
}